

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

void rep0_ctx_cancel_send(nni_aio *aio,void *arg,int rv)

{
  nni_mtx *mtx;
  nni_msg *m;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  if (*(nni_aio **)((long)arg + 0x18) != aio) {
    nni_mtx_unlock(mtx);
    return;
  }
  nni_list_node_remove((nni_list_node *)((long)arg + 0x28));
  *(undefined8 *)((long)arg + 0x18) = 0;
  nni_mtx_unlock(mtx);
  m = nni_aio_get_msg(aio);
  nni_msg_header_clear(m);
  nni_aio_finish_error(aio,rv);
  return;
}

Assistant:

static void
rep0_ctx_cancel_send(nni_aio *aio, void *arg, int rv)
{
	rep0_ctx  *ctx = arg;
	rep0_sock *s   = ctx->sock;

	nni_mtx_lock(&s->lk);
	if (ctx->saio != aio) {
		nni_mtx_unlock(&s->lk);
		return;
	}
	nni_list_node_remove(&ctx->sqnode);
	ctx->saio = NULL;
	nni_mtx_unlock(&s->lk);

	nni_msg_header_clear(nni_aio_get_msg(aio)); // reset the headers
	nni_aio_finish_error(aio, rv);
}